

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

TValue * cpcall(lua_State *L,lua_CFunction func,void *ud)

{
  TValue *pTVar1;
  GCfunc *pGVar2;
  ulong in_RDX;
  lua_CFunction in_RSI;
  lua_State *in_RDI;
  GCfunc *fn;
  ErrMsg in_stack_ffffffffffffff7c;
  lua_State *in_stack_ffffffffffffff80;
  lua_State *plVar3;
  lua_State *in_stack_ffffffffffffff90;
  
  plVar3 = in_RDI;
  getcurrenv(in_RDI);
  pGVar2 = lj_func_newC(in_stack_ffffffffffffff90,(MSize)((ulong)plVar3 >> 0x20),
                        (GCtab *)in_stack_ffffffffffffff80);
  (pGVar2->c).f = in_RSI;
  pTVar1 = in_RDI->top;
  (pTVar1->u32).lo = (uint32_t)pGVar2;
  (pTVar1->field_2).it = 0xfffffff7;
  if (in_RDX >> 0x2f != 0) {
    lj_err_msg(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  in_RDI->top[1].u64 = in_RDX | 0xffff000000000000;
  *(undefined4 *)((long)in_RDI->cframe + 0x10) = 1;
  in_RDI->top = in_RDI->top + 2;
  return in_RDI->top + -1;
}

Assistant:

static TValue *cpcall(lua_State *L, lua_CFunction func, void *ud)
{
  GCfunc *fn = lj_func_newC(L, 0, getcurrenv(L));
  fn->c.f = func;
  setfuncV(L, L->top, fn);
  setlightudV(L->top+1, checklightudptr(L, ud));
  cframe_nres(L->cframe) = 1+0;  /* Zero results. */
  L->top += 2;
  return L->top-1;  /* Now call the newly allocated C function. */
}